

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.h
# Opt level: O1

void __thiscall JsonModelSerialiser::~JsonModelSerialiser(JsonModelSerialiser *this)

{
  AbstractStringSerialiser::~AbstractStringSerialiser(&this->super_AbstractStringSerialiser);
  operator_delete(this,0x18);
  return;
}

Assistant:

class MODELUTILITIES_EXPORT JsonModelSerialiser : public AbstractStringSerialiser
{
    Q_OBJECT
    Q_DECLARE_PRIVATE(JsonModelSerialiser)
    Q_DISABLE_COPY(JsonModelSerialiser)
public:
    explicit JsonModelSerialiser(QObject *parent = Q_NULLPTR);
    JsonModelSerialiser(QAbstractItemModel *model, QObject *parent);
    JsonModelSerialiser(const QAbstractItemModel *model, QObject *parent);
    bool saveModel(QIODevice *destination) const Q_DECL_OVERRIDE;
    bool saveModel(QByteArray *destination) const Q_DECL_OVERRIDE;
    bool saveModel(QString *destination) const Q_DECL_OVERRIDE;
    Q_INVOKABLE virtual QJsonObject toJsonObject() const;
    bool loadModel(QIODevice *source) Q_DECL_OVERRIDE;
    bool loadModel(const QByteArray &source) Q_DECL_OVERRIDE;
    bool loadModel(QString *source) Q_DECL_OVERRIDE;
    Q_INVOKABLE virtual bool fromJsonObject(const QJsonObject &source);
    Q_INVOKABLE QJsonDocument::JsonFormat format() const;
public Q_SLOTS:
    void setFormat(QJsonDocument::JsonFormat val);

protected:
    JsonModelSerialiser(JsonModelSerialiserPrivate &d, QObject *parent);
}